

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderLoopTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Functional::ShaderLoopCase::init(ShaderLoopCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  CompileFailed *anon_var_0;
  bool isSupported;
  ShaderLoopCase *this_local;
  
  if (this->m_requirement == LOOPREQUIREMENT_UNIFORM) {
    if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
      (*((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo[8])();
    }
    else {
      (*((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo[5])();
    }
  }
  else if (this->m_requirement == LOOPREQUIREMENT_DYNAMIC) {
    if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
      (*((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo[9])();
    }
    else {
      (*((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo[6])();
    }
  }
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar1;
}

Assistant:

void ShaderLoopCase::init (void)
{
	bool isSupported = true;

	if (m_requirement == LOOPREQUIREMENT_UNIFORM)
		isSupported = m_isVertexCase ? m_ctxInfo.isVertexUniformLoopSupported()
									 : m_ctxInfo.isFragmentUniformLoopSupported();
	else if (m_requirement == LOOPREQUIREMENT_DYNAMIC)
		isSupported = m_isVertexCase ? m_ctxInfo.isVertexDynamicLoopSupported()
									 : m_ctxInfo.isFragmentDynamicLoopSupported();

	try
	{
		ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (!isSupported)
			throw tcu::NotSupportedError("Loop type is not supported");
		else
			throw;
	}
}